

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actions.hpp
# Opt level: O0

event_process_result
afsm::actions::detail::
inner_dispatch_table<std::tuple<afsm::state<afsm::test::json_parser_def::context::object::colon,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::name,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_>
::process_event<afsm::test::events::string_literal>
          (states_tuple *states,size_t current_state,string_literal *event)

{
  event_process_result eVar1;
  logic_error *this;
  invocation_table<afsm::test::events::string_literal> *piVar2;
  reference this_00;
  indexes_tuple<0UL,_1UL,_2UL> local_91;
  undefined1 local_90 [8];
  invocation_table<afsm::test::events::string_literal> inv_table;
  string_literal *event_local;
  size_t current_state_local;
  states_tuple *states_local;
  
  if (2 < current_state) {
    this = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this,"Invalid current state index");
    __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  piVar2 = inner_dispatch_table<std::tuple<afsm::state<afsm::test::json_parser_def::context::object::colon,afsm::inner_state_machine<afsm::test::json_parser_def::context::object,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>,afsm::state<afsm::test::json_parser_def::context::object::value,afsm::inner_state_machine<afsm::test::json_parser_def::context::object,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>,afsm::state<afsm::test::json_parser_def::context::object::name,afsm::inner_state_machine<afsm::test::json_parser_def::context::object,afsm::inner_state_machine<afsm::test::json_parser_def::context,afsm::state_machine<afsm::test::json_parser_def,afsm::none,afsm::none,afsm::detail::observer_wrapper>>>>>>
           ::state_table<afsm::test::events::string_literal,0ul,1ul,2ul>(&local_91);
  std::
  array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::object::colon,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::name,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_afsm::test::events::string_literal_&&)>,_3UL>
  ::array((array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::object::colon,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::name,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_afsm::test::events::string_literal_&&)>,_3UL>
           *)local_90,piVar2);
  this_00 = std::
            array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::object::colon,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::name,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_afsm::test::events::string_literal_&&)>,_3UL>
            ::operator[]((array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::object::colon,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::name,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_afsm::test::events::string_literal_&&)>,_3UL>
                          *)local_90,current_state);
  eVar1 = std::
          function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::object::colon,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::name,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_afsm::test::events::string_literal_&&)>
          ::operator()(this_00,states,event);
  std::
  array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::object::colon,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::name,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_afsm::test::events::string_literal_&&)>,_3UL>
  ::~array((array<std::function<afsm::actions::event_process_result_(std::tuple<afsm::state<afsm::test::json_parser_def::context::object::colon,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::value,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>,_afsm::state<afsm::test::json_parser_def::context::object::name,_afsm::inner_state_machine<afsm::test::json_parser_def::context::object,_afsm::inner_state_machine<afsm::test::json_parser_def::context,_afsm::state_machine<afsm::test::json_parser_def,_afsm::none,_afsm::none,_afsm::detail::observer_wrapper>_>_>_>_>_&,_afsm::test::events::string_literal_&&)>,_3UL>
            *)local_90);
  return eVar1;
}

Assistant:

static event_process_result
    process_event(states_tuple& states, ::std::size_t current_state, Event&& event)
    {
        //using event_type = typename ::std::decay<Event>::type;
        if (current_state >= size)
            throw ::std::logic_error{ "Invalid current state index" };
        auto inv_table = state_table< Event >(indexes_tuple{});
        return inv_table[current_state](states, ::std::forward<Event>(event));
    }